

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracepointgen.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  QFlags<QIODeviceBase::OpenModeFlag> QVar2;
  uint uVar3;
  char *pcVar4;
  QString *pQVar5;
  char *pcVar6;
  QString *__n;
  int __oflag;
  int __oflag_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  Parser *pPVar7;
  long in_FS_OFFSET;
  QString *inputFile;
  QList<QString> *__range1;
  QFile out;
  QFile in;
  QStringList includeDirs;
  iterator __end1;
  iterator __begin1;
  Parser parser;
  QString outFile;
  QList<QString> inputFiles;
  QString provider;
  undefined4 in_stack_fffffffffffffd68;
  SplitBehaviorFlags in_stack_fffffffffffffd6c;
  Parser *in_stack_fffffffffffffd70;
  Parser *this;
  QString *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  QString *in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffd90;
  int argc_00;
  QFlagsStorage<Qt::SplitBehaviorFlags> in_stack_fffffffffffffda8;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> in_stack_fffffffffffffdac;
  QString *in_stack_fffffffffffffdd0;
  QIODevice *in_stack_fffffffffffffdd8;
  Parser *in_stack_fffffffffffffde0;
  QFile local_1e8;
  QString local_1c0 [3];
  QFile local_178;
  uint local_168;
  QLatin1Char local_163 [27];
  qsizetype local_148;
  Data *local_140;
  char16_t *local_138;
  QLatin1Char local_12b [3];
  QString *local_128;
  iterator local_120;
  iterator local_118;
  Parser local_110;
  QString local_50;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  QString local_20;
  long local_8;
  
  argc_00 = (int)((ulong)in_stack_fffffffffffffd90 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_20.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_20.d.size = -0x5555555555555556;
  QString::QString((QString *)0x104e87);
  local_38 = 0xaaaaaaaaaaaaaaaa;
  local_30 = 0xaaaaaaaaaaaaaaaa;
  local_28 = 0xaaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x104ec1);
  local_50.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_50.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_50.d.size = -0x5555555555555556;
  QString::QString((QString *)0x104efb);
  __n = &local_50;
  parseArgs(argc_00,(char **)in_stack_fffffffffffffd88,
            (QString *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
            in_stack_fffffffffffffd78,(QList<QString> *)in_stack_fffffffffffffd70);
  memset(&local_110,0xaa,0xc0);
  Parser::Parser(in_stack_fffffffffffffd70,
                 (QString *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  local_118.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_118 = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffffd70);
  local_120.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_120 = QList<QString>::end((QList<QString> *)in_stack_fffffffffffffd70);
  while( true ) {
    local_128 = local_120.i;
    bVar1 = QList<QString>::iterator::operator!=(&local_118,local_120);
    if (!bVar1) break;
    pQVar5 = QList<QString>::iterator::operator*(&local_118);
    QLatin1Char::QLatin1Char(local_12b,'I');
    QChar::QChar<QLatin1Char,_true>
              ((QChar *)in_stack_fffffffffffffd70,
               (QLatin1Char)(char)((ulong)in_stack_fffffffffffffd78 >> 0x38));
    bVar1 = QString::startsWith(in_stack_fffffffffffffd78,
                                (QChar)(char16_t)((ulong)in_stack_fffffffffffffd88 >> 0x30),
                                (CaseSensitivity)((ulong)in_stack_fffffffffffffd70 >> 0x20));
    if (bVar1) {
      local_148 = -0x5555555555555556;
      local_140 = (Data *)0xaaaaaaaaaaaaaaaa;
      local_138 = (char16_t *)0xaaaaaaaaaaaaaaaa;
      QString::length((QString *)0x10508c);
      QString::right(in_stack_fffffffffffffd88,
                     CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
      QLatin1Char::QLatin1Char(local_163,';');
      QChar::QChar<QLatin1Char,_true>
                ((QChar *)in_stack_fffffffffffffd70,
                 (QLatin1Char)(char)((ulong)in_stack_fffffffffffffd78 >> 0x38));
      QFlags<Qt::SplitBehaviorFlags>::QFlags
                ((QFlags<Qt::SplitBehaviorFlags> *)in_stack_fffffffffffffd70,
                 in_stack_fffffffffffffd6c);
      __n = (QString *)(ulong)local_168;
      QString::split((QString *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                     (QChar)(char16_t)(in_stack_fffffffffffffdac.i >> 0x10),
                     (SplitBehavior)in_stack_fffffffffffffda8.i,
                     (CaseSensitivity)((ulong)in_stack_fffffffffffffd78 >> 0x20));
      QString::~QString((QString *)0x105115);
      Parser::addIncludeDirs
                (in_stack_fffffffffffffd70,
                 (QStringList *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      QList<QString>::~QList((QList<QString> *)0x105137);
    }
    else {
      local_178.super_QFileDevice.super_QIODevice._vptr_QIODevice = (_func_int **)0xaaaaaaaaaaaaaaaa
      ;
      local_178.super_QFileDevice.super_QIODevice.d_ptr._M_t.
      super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
      super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
      super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl =
           (__uniq_ptr_data<QIODevicePrivate,_std::default_delete<QIODevicePrivate>,_true,_true>)
           (__uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>)
           0xaaaaaaaaaaaaaaaa;
      QFile::QFile((QFile *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                   in_stack_fffffffffffffd78);
      in_stack_fffffffffffffdac.i =
           (Int)operator|((enum_type)((ulong)in_stack_fffffffffffffd70 >> 0x20),
                          (enum_type)in_stack_fffffffffffffd70);
      uVar3 = QFile::open(&local_178,(char *)(ulong)in_stack_fffffffffffffdac.i,__oflag);
      if ((uVar3 & 1) == 0) {
        QtPrivate::asString(pQVar5);
        QString::toLocal8Bit(in_stack_fffffffffffffd88);
        pcVar6 = QByteArray::constData((QByteArray *)0x1051bf);
        QIODevice::errorString
                  ((QIODevice *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
        QtPrivate::asString(local_1c0);
        QString::toLocal8Bit(in_stack_fffffffffffffd88);
        pcVar4 = QByteArray::constData((QByteArray *)0x105203);
        panic("Cannot open \'%s\' for reading: %s\n",pcVar6,pcVar4);
        QByteArray::~QByteArray((QByteArray *)0x105226);
        QString::~QString((QString *)0x105233);
        QByteArray::~QByteArray((QByteArray *)0x105240);
      }
      Parser::parse(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
      QFile::~QFile((QFile *)0x105267);
    }
    QList<QString>::iterator::operator++(&local_118);
  }
  bVar1 = Parser::isEmpty(in_stack_fffffffffffffd70);
  if (bVar1) {
    QtPrivate::asString(&local_20);
    QString::toLocal8Bit(in_stack_fffffffffffffd88);
    pcVar6 = QByteArray::constData((QByteArray *)0x1052b6);
    panic("empty provider %s\n",pcVar6);
    QByteArray::~QByteArray((QByteArray *)0x1052d4);
  }
  local_1e8.super_QFileDevice.super_QIODevice._vptr_QIODevice = (_func_int **)0xaaaaaaaaaaaaaaaa;
  local_1e8.super_QFileDevice.super_QIODevice.d_ptr._M_t.
  super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
  super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
  super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl =
       (__uniq_ptr_data<QIODevicePrivate,_std::default_delete<QIODevicePrivate>,_true,_true>)
       (__uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>)0xaaaaaaaaaaaaaaaa
  ;
  QFile::QFile((QFile *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
               in_stack_fffffffffffffd78);
  QVar2 = operator|((enum_type)((ulong)in_stack_fffffffffffffd70 >> 0x20),
                    (enum_type)in_stack_fffffffffffffd70);
  uVar3 = QFile::open(&local_1e8,
                      (char *)(ulong)(uint)QVar2.
                                           super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>
                                           .super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i,
                      __oflag_00);
  __buf = extraout_RDX;
  if ((uVar3 & 1) == 0) {
    QtPrivate::asString(&local_50);
    QString::toLocal8Bit(in_stack_fffffffffffffd88);
    pQVar5 = (QString *)QByteArray::constData((QByteArray *)0x10535d);
    QIODevice::errorString
              ((QIODevice *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
    QtPrivate::asString((QString *)&stack0xfffffffffffffdd0);
    QString::toLocal8Bit(pQVar5);
    pcVar6 = QByteArray::constData((QByteArray *)0x10539b);
    panic("Cannot open \'%s\' for writing: %s\n",pQVar5,pcVar6);
    QByteArray::~QByteArray((QByteArray *)0x1053be);
    QString::~QString((QString *)0x1053c8);
    QByteArray::~QByteArray((QByteArray *)0x1053d5);
    __buf = extraout_RDX_00;
  }
  pPVar7 = (Parser *)&local_1e8;
  this = pPVar7;
  Parser::write(&local_110,(int)pPVar7,__buf,(size_t)__n);
  QFileDevice::close((QFileDevice *)this,(int)pPVar7);
  QFile::~QFile((QFile *)0x105410);
  Parser::~Parser(this);
  QString::~QString((QString *)0x105427);
  QList<QString>::~QList((QList<QString> *)0x105434);
  QString::~QString((QString *)0x105441);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    QString provider;
    QList<QString> inputFiles;
    QString outFile;

    parseArgs(argc, argv, provider, outFile, inputFiles);

    Parser parser(provider);

    for (const QString &inputFile : inputFiles) {
        if (inputFile.startsWith(QLatin1Char('I'))) {
            QStringList includeDirs = inputFile.right(inputFile.length() - 1).split(QLatin1Char(';'));
            parser.addIncludeDirs(includeDirs);
            continue;
        }
        QFile in(inputFile);
        if (!in.open(QIODevice::ReadOnly | QIODevice::Text)) {
            panic("Cannot open '%s' for reading: %s\n",
                    qPrintable(inputFile), qPrintable(in.errorString()));
        }
        DEBUGPRINTF(printf("tracepointgen: parse %s\n", qPrintable(inputFile)));
        parser.parse(in, inputFile);
    }
    if (parser.isEmpty())
        panic("empty provider %s\n", qPrintable(provider));

    QFile out(outFile);

    if (!out.open(QIODevice::WriteOnly | QIODevice::Truncate)) {
        panic("Cannot open '%s' for writing: %s\n",
                qPrintable(outFile), qPrintable(out.errorString()));
    }

    parser.write(out);
    out.close();

    return 0;
}